

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_mem.cpp
# Opt level: O2

void * lzham::lzham_malloc(lzham_malloc_context context,size_t size,size_t *pActual_size)

{
  size_t in_RAX;
  void *pvVar1;
  char *p_msg;
  char *pcVar2;
  char *pcVar3;
  size_t actual_size;
  
  p_msg = (char *)size;
  actual_size = in_RAX;
  if (context == (lzham_malloc_context)0x0) {
    p_msg = 
    "/workspace/llm4binary/github/license_c_cmakelists/richgel999[P]lzham_codec_devel/lzhamdecomp/lzham_mem.cpp"
    ;
    lzham_assert("context",
                 "/workspace/llm4binary/github/license_c_cmakelists/richgel999[P]lzham_codec_devel/lzhamdecomp/lzham_mem.cpp"
                 ,0x10f);
  }
  pcVar3 = (char *)(size + 3 & 0xfffffffffffffffc);
  pcVar2 = (char *)0x4;
  if (pcVar3 != (char *)0x0) {
    pcVar2 = pcVar3;
  }
  if (pcVar2 < (char *)0x400000001) {
    actual_size = (size_t)pcVar2;
    if (*context != 0x5749abcd) {
      lzham_assert("pContext->m_sig == malloc_context::cSig",
                   "/workspace/llm4binary/github/license_c_cmakelists/richgel999[P]lzham_codec_devel/lzhamdecomp/lzham_mem.cpp"
                   ,0x120);
    }
    p_msg = pcVar2;
    pvVar1 = malloc_context::arena_alloc((malloc_context *)context,(size_t)pcVar2);
    pcVar3 = pcVar2;
    if (pvVar1 == (void *)0x0) {
      p_msg = pcVar2;
      pvVar1 = (void *)(*(code *)g_pRealloc)(0,pcVar2,&actual_size,1,g_pUser_data);
      pcVar3 = (char *)actual_size;
    }
    if (pActual_size != (size_t *)0x0) {
      *pActual_size = (size_t)pcVar3;
    }
    if (pcVar2 <= pcVar3 && pvVar1 != (void *)0x0) {
      return pvVar1;
    }
    pcVar2 = "lzham_malloc: out of memory";
  }
  else {
    pcVar2 = "lzham_malloc: size too big";
  }
  lzham_mem_error(pcVar2,p_msg);
  return (void *)0x0;
}

Assistant:

void* lzham_malloc(lzham_malloc_context context, size_t size, size_t* pActual_size)
   {
      LZHAM_VERIFY(context);
      
      size = (size + sizeof(uint32) - 1U) & ~(sizeof(uint32) - 1U);
      if (!size)
         size = sizeof(uint32);

      if (size > MAX_POSSIBLE_BLOCK_SIZE)
      {
         lzham_mem_error(context, "lzham_malloc: size too big");
         return NULL;
      }

      size_t actual_size = size;
      uint8* p_new;

      malloc_context *pContext = static_cast<malloc_context *>(context);

      LZHAM_VERIFY(pContext->m_sig == malloc_context::cSig);

      p_new = static_cast<uint8 *>(pContext->arena_alloc(size));
      if (!p_new)
      {
         p_new = static_cast<uint8*>((*g_pRealloc)(NULL, size, &actual_size, true, g_pUser_data));
      }

      if (pActual_size)
         *pActual_size = actual_size;

      if ((!p_new) || (actual_size < size))
      {
         lzham_mem_error(context, "lzham_malloc: out of memory");
         return NULL;
      }

      LZHAM_ASSERT((reinterpret_cast<ptr_bits_t>(p_new) & (LZHAM_MIN_ALLOC_ALIGNMENT - 1)) == 0);

#if LZHAM_MEM_STATS
      pContext->update_total_allocated(1, static_cast<int64>(actual_size));
#endif

      return p_new;
   }